

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib518.c
# Opt level: O2

int rlimit(int keep_open)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  FILE *pFVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  rlimit rl;
  char strbuff [256];
  char strbuff1 [81];
  char strbuff2 [81];
  
  iVar3 = getrlimit64(RLIMIT_NOFILE,(rlimit64 *)&rl);
  if (iVar3 == 0) {
    if (rl.rlim_cur == 0xffffffffffffffff) {
      builtin_strncpy(strbuff,"INFINITY",8);
      strbuff._8_8_ = strbuff._8_8_ & 0xffffffffffffff00;
    }
    else {
      sprintf(strbuff,"%lu");
    }
    fprintf(_stderr,"initial soft limit: %s\n",strbuff);
    if (rl.rlim_max == 0xffffffffffffffff) {
      builtin_strncpy(strbuff,"INFINITY",8);
      strbuff._8_8_ = strbuff._8_8_ & 0xffffffffffffff00;
    }
    else {
      sprintf(strbuff,"%lu");
    }
    fprintf(_stderr,"initial hard limit: %s\n",strbuff);
    fprintf(_stderr,"test518 FD_SETSIZE: %d\n",0x400);
    fprintf(_stderr,"test518 NUM_OPEN  : %d\n",0x40a);
    fprintf(_stderr,"test518 NUM_NEEDED: %d\n",0x41a);
    if (rl.rlim_cur != rl.rlim_max) {
      fwrite("raising soft limit up to hard limit\n",0x24,1,_stderr);
      rl.rlim_cur = rl.rlim_max;
      iVar3 = setrlimit64(RLIMIT_NOFILE,(rlimit64 *)&rl);
      if (iVar3 != 0) {
        piVar4 = __errno_location();
        store_errmsg("setrlimit() failed",*piVar4);
        fprintf(_stderr,"%s\n",msgbuff);
        msgbuff[0] = '\0';
      }
      iVar3 = getrlimit64(RLIMIT_NOFILE,(rlimit64 *)&rl);
      if (iVar3 != 0) {
        piVar4 = __errno_location();
        store_errmsg("getrlimit() failed",*piVar4);
        fprintf(_stderr,"%s\n",msgbuff);
        return -3;
      }
      if (rl.rlim_cur == 0xffffffffffffffff) {
        builtin_strncpy(strbuff,"INFINITY",8);
        strbuff._8_8_ = strbuff._8_8_ & 0xffffffffffffff00;
      }
      else {
        sprintf(strbuff,"%lu");
      }
      fprintf(_stderr,"current soft limit: %s\n",strbuff);
      if (rl.rlim_max == 0xffffffffffffffff) {
        builtin_strncpy(strbuff,"INFINITY",8);
        strbuff._8_8_ = strbuff._8_8_ & 0xffffffffffffff00;
      }
      else {
        sprintf(strbuff,"%lu");
      }
      fprintf(_stderr,"current hard limit: %s\n",strbuff);
    }
    num_open_0 = 0x41a;
    if (rl.rlim_cur - 1 < 0x41a) {
      sprintf(strbuff2,"%lu");
      sprintf(strbuff1,"%lu",num_open_0);
      sprintf(strbuff,"fds needed %s > system limit %s",strbuff1,strbuff2);
      strcpy(msgbuff,strbuff);
      fprintf(_stderr,"%s\n",msgbuff);
      iVar3 = -4;
    }
    else {
      uVar2 = 1;
      uVar7 = 1;
      do {
        uVar9 = uVar7;
        uVar7 = uVar2;
        uVar2 = uVar7 * 2;
      } while (uVar9 <= uVar7);
      uVar10 = 0x40000;
      if (uVar9 < 0x8000) {
        uVar10 = (ulong)uVar9;
      }
      num_open_1 = uVar10 << 2;
      sprintf(strbuff,"%lu");
      fprintf(_stderr,"allocating memchunk %s byte array\n",strbuff);
      fwrite("initializing memchunk array\n",0x1c,1,_stderr);
      num_open_1 = 0x40a;
      sprintf(strbuff,"%lu",0x40a);
      fprintf(_stderr,"allocating array for %s file descriptors\n",strbuff);
      fd = (int *)malloc(num_open_1 << 2);
      if (fd == (int *)0x0) {
        piVar4 = __errno_location();
        store_errmsg("fd, malloc() failed",*piVar4);
        fprintf(_stderr,"%s\n",msgbuff);
        iVar3 = -7;
      }
      else {
        uVar10 = 1;
        fwrite("initializing fd array\n",0x16,1,_stderr);
        piVar4 = fd;
        num_open_0 = num_open_1;
        for (uVar5 = 0; num_open_0 != uVar5; uVar5 = uVar5 + 1) {
          piVar4[uVar5] = -1;
        }
        sprintf(strbuff,"%lu");
        fprintf(_stderr,"trying to open %s file descriptors\n",strbuff);
        iVar3 = open64("/dev/null",0);
        piVar4 = fd;
        *fd = iVar3;
        if (iVar3 < 0) {
          sprintf(strbuff,"opening of %s failed","/dev/null");
          piVar4 = __errno_location();
          store_errmsg(strbuff,*piVar4);
          fprintf(_stderr,"%s\n",msgbuff);
          free(fd);
          fd = (int *)0x0;
          iVar3 = -8;
        }
        else {
          for (; num_open_0 = uVar10, uVar10 < num_open_1; uVar10 = uVar10 + 1) {
            iVar3 = dup(*piVar4);
            piVar4 = fd;
            uVar10 = num_open_0;
            fd[num_open_0] = iVar3;
            if (iVar3 < 0) {
              piVar4[uVar10] = -1;
              sprintf(strbuff1,"%lu",uVar10);
              sprintf(strbuff,"dup() attempt %s failed",strbuff1);
              fprintf(_stderr,"%s\n",strbuff);
              sprintf(strbuff1,"%lu",num_open_0);
              sprintf(strbuff,"fds system limit seems close to %s",strbuff1);
              fprintf(_stderr,"%s\n",strbuff);
              num_open_1 = 0x41a;
              sprintf(strbuff2,"%lu",0x41a);
              sprintf(strbuff1,"%lu",num_open_0);
              sprintf(strbuff,"fds needed %s > system limit %s",strbuff2,strbuff1);
              strcpy(msgbuff,strbuff);
              fprintf(_stderr,"%s\n",msgbuff);
              for (num_open_0 = 0; -1 < fd[num_open_0]; num_open_0 = num_open_0 + 1) {
                close(fd[num_open_0]);
              }
              free(fd);
              fd = (int *)0x0;
              return -9;
            }
          }
          sprintf(strbuff,"%lu");
          fprintf(_stderr,"%s file descriptors open\n",strbuff);
          for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
            pcVar1 = strbuff1 + lVar11 * 8;
            pcVar1[0] = '\0';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\0';
            pcVar1[5] = '\0';
            pcVar1[6] = '\0';
            pcVar1[7] = '\0';
          }
          lVar11 = 0;
          do {
            lVar8 = lVar11;
            if (lVar8 == 3) goto LAB_00102975;
            pFVar6 = fopen64("/dev/null","r");
            *(FILE **)(strbuff1 + lVar8 * 8) = pFVar6;
            lVar11 = lVar8 + 1;
          } while (pFVar6 != (FILE *)0x0);
          piVar4 = __errno_location();
          store_errmsg("fopen() failed",*piVar4);
          fprintf(_stderr,"%s\n",msgbuff);
LAB_00102975:
          for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
            if (*(FILE **)(strbuff1 + lVar11 * 8) != (FILE *)0x0) {
              fclose(*(FILE **)(strbuff1 + lVar11 * 8));
            }
          }
          if (lVar8 == 3) {
            iVar3 = 0;
            if (keep_open == 0) {
              close_file_descriptors();
              iVar3 = 0;
            }
          }
          else {
            sprintf(strbuff1,"%lu",num_open_1);
            sprintf(strbuff,"stdio fopen() fails with %s fds open()",strbuff1);
            fprintf(_stderr,"%s\n",msgbuff);
            builtin_strncpy(strbuff,"stdio fopen() fails with lots of fds open()",0x2c);
            strcpy(msgbuff,strbuff);
            close_file_descriptors();
            iVar3 = -0xc;
          }
        }
      }
    }
  }
  else {
    piVar4 = __errno_location();
    store_errmsg("getrlimit() failed",*piVar4);
    fprintf(_stderr,"%s\n",msgbuff);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int rlimit(int keep_open)
{
  int nitems, i;
  int *memchunk = NULL;
  char *fmt;
  struct rlimit rl;
  char strbuff[256];
  char strbuff1[81];
  char strbuff2[81];
  char fmt_u[] = "%u";
  char fmt_lu[] = "%lu";
#ifdef HAVE_LONGLONG
  char fmt_llu[] = "%llu";

  if (sizeof(rl.rlim_max) > sizeof(long))
    fmt = fmt_llu;
  else
#endif
    fmt = (sizeof(rl.rlim_max) < sizeof(long))?fmt_u:fmt_lu;

  /* get initial open file limits */

  if (getrlimit(RLIMIT_NOFILE, &rl) != 0) {
    store_errmsg("getrlimit() failed", ERRNO);
    fprintf(stderr, "%s\n", msgbuff);
    return -1;
  }

  /* show initial open file limits */

#ifdef RLIM_INFINITY
  if (rl.rlim_cur == RLIM_INFINITY)
    strcpy(strbuff, "INFINITY");
  else
#endif
    sprintf(strbuff, fmt, rl.rlim_cur);
  fprintf(stderr, "initial soft limit: %s\n", strbuff);

#ifdef RLIM_INFINITY
  if (rl.rlim_max == RLIM_INFINITY)
    strcpy(strbuff, "INFINITY");
  else
#endif
    sprintf(strbuff, fmt, rl.rlim_max);
  fprintf(stderr, "initial hard limit: %s\n", strbuff);

  /* show our constants */

  fprintf(stderr, "test518 FD_SETSIZE: %d\n", FD_SETSIZE);
  fprintf(stderr, "test518 NUM_OPEN  : %d\n", NUM_OPEN);
  fprintf(stderr, "test518 NUM_NEEDED: %d\n", NUM_NEEDED);

  /*
   * if soft limit and hard limit are different we ask the
   * system to raise soft limit all the way up to the hard
   * limit. Due to some other system limit the soft limit
   * might not be raised up to the hard limit. So from this
   * point the resulting soft limit is our limit. Trying to
   * open more than soft limit file descriptors will fail.
   */

  if (rl.rlim_cur != rl.rlim_max) {

#ifdef OPEN_MAX
    if ((rl.rlim_cur > 0) &&
        (rl.rlim_cur < OPEN_MAX)) {
      fprintf(stderr, "raising soft limit up to OPEN_MAX\n");
      rl.rlim_cur = OPEN_MAX;
      if (setrlimit(RLIMIT_NOFILE, &rl) != 0) {
        /* on failure don't abort just issue a warning */
        store_errmsg("setrlimit() failed", ERRNO);
        fprintf(stderr, "%s\n", msgbuff);
        msgbuff[0] = '\0';
      }
    }
#endif

    fprintf(stderr, "raising soft limit up to hard limit\n");
    rl.rlim_cur = rl.rlim_max;
    if (setrlimit(RLIMIT_NOFILE, &rl) != 0) {
      /* on failure don't abort just issue a warning */
      store_errmsg("setrlimit() failed", ERRNO);
      fprintf(stderr, "%s\n", msgbuff);
      msgbuff[0] = '\0';
    }

    /* get current open file limits */

    if (getrlimit(RLIMIT_NOFILE, &rl) != 0) {
      store_errmsg("getrlimit() failed", ERRNO);
      fprintf(stderr, "%s\n", msgbuff);
      return -3;
    }

    /* show current open file limits */

#ifdef RLIM_INFINITY
    if (rl.rlim_cur == RLIM_INFINITY)
      strcpy(strbuff, "INFINITY");
    else
#endif
      sprintf(strbuff, fmt, rl.rlim_cur);
    fprintf(stderr, "current soft limit: %s\n", strbuff);

#ifdef RLIM_INFINITY
    if (rl.rlim_max == RLIM_INFINITY)
      strcpy(strbuff, "INFINITY");
    else
#endif
      sprintf(strbuff, fmt, rl.rlim_max);
    fprintf(stderr, "current hard limit: %s\n", strbuff);

  } /* (rl.rlim_cur != rl.rlim_max) */

  /*
   * test 518 is all about testing libcurl functionality
   * when more than FD_SETSIZE file descriptors are open.
   * This means that if for any reason we are not able to
   * open more than FD_SETSIZE file descriptors then test
   * 518 should not be run.
   */

  /*
   * verify that soft limit is higher than NUM_NEEDED,
   * which is the number of file descriptors we would
   * try to open plus SAFETY_MARGIN to not exhaust the
   * file descriptor pool
   */

  num_open.rlim_cur = NUM_NEEDED;

  if ((rl.rlim_cur > 0) &&
#ifdef RLIM_INFINITY
     (rl.rlim_cur != RLIM_INFINITY) &&
#endif
     (rl.rlim_cur <= num_open.rlim_cur)) {
    sprintf(strbuff2, fmt, rl.rlim_cur);
    sprintf(strbuff1, fmt, num_open.rlim_cur);
    sprintf(strbuff, "fds needed %s > system limit %s",
            strbuff1, strbuff2);
    store_errmsg(strbuff, 0);
    fprintf(stderr, "%s\n", msgbuff);
    return -4;
  }

  /*
   * reserve a chunk of memory before opening file descriptors to
   * avoid a low memory condition once the file descriptors are
   * open. System conditions that could make the test fail should
   * be addressed in the precheck phase. This chunk of memory shall
   * be always free()ed before exiting the rlimit() function so
   * that it becomes available to the test.
   */

  for (nitems = i = 1; nitems <= i; i *= 2)
    nitems = i;
  if (nitems > 0x7fff)
    nitems = 0x40000;
  do {
    num_open.rlim_max = sizeof(*memchunk) * (size_t)nitems;
    sprintf(strbuff, fmt, num_open.rlim_max);
    fprintf(stderr, "allocating memchunk %s byte array\n", strbuff);
    memchunk = malloc(sizeof(*memchunk) * (size_t)nitems);
    if (!memchunk) {
      fprintf(stderr, "memchunk, malloc() failed\n");
      nitems /= 2;
    }
  } while (nitems && !memchunk);
  if (!memchunk) {
    store_errmsg("memchunk, malloc() failed", ERRNO);
    fprintf(stderr, "%s\n", msgbuff);
    return -5;
  }

  /* initialize it to fight lazy allocation */

  fprintf(stderr, "initializing memchunk array\n");

  for (i = 0; i < nitems; i++)
    memchunk[i] = -1;

  /* set the number of file descriptors we will try to open */

  num_open.rlim_max = NUM_OPEN;

  /* verify that we won't overflow size_t in malloc() */

  if ((size_t)(num_open.rlim_max) > ((size_t)-1) / sizeof(*fd)) {
    sprintf(strbuff1, fmt, num_open.rlim_max);
    sprintf(strbuff, "unable to allocate an array for %s "
            "file descriptors, would overflow size_t", strbuff1);
    store_errmsg(strbuff, 0);
    fprintf(stderr, "%s\n", msgbuff);
    free(memchunk);
    return -6;
  }

  /* allocate array for file descriptors */

  sprintf(strbuff, fmt, num_open.rlim_max);
  fprintf(stderr, "allocating array for %s file descriptors\n", strbuff);

  fd = malloc(sizeof(*fd) * (size_t)(num_open.rlim_max));
  if (!fd) {
    store_errmsg("fd, malloc() failed", ERRNO);
    fprintf(stderr, "%s\n", msgbuff);
    free(memchunk);
    return -7;
  }

  /* initialize it to fight lazy allocation */

  fprintf(stderr, "initializing fd array\n");

  for (num_open.rlim_cur = 0;
       num_open.rlim_cur < num_open.rlim_max;
       num_open.rlim_cur++)
    fd[num_open.rlim_cur] = -1;

  sprintf(strbuff, fmt, num_open.rlim_max);
  fprintf(stderr, "trying to open %s file descriptors\n", strbuff);

  /* open a dummy descriptor */

  fd[0] = open(DEV_NULL, O_RDONLY);
  if (fd[0] < 0) {
    sprintf(strbuff, "opening of %s failed", DEV_NULL);
    store_errmsg(strbuff, ERRNO);
    fprintf(stderr, "%s\n", msgbuff);
    free(fd);
    fd = NULL;
    free(memchunk);
    return -8;
  }

  /* create a bunch of file descriptors */

  for (num_open.rlim_cur = 1;
       num_open.rlim_cur < num_open.rlim_max;
       num_open.rlim_cur++) {

    fd[num_open.rlim_cur] = dup(fd[0]);

    if (fd[num_open.rlim_cur] < 0) {

      fd[num_open.rlim_cur] = -1;

      sprintf(strbuff1, fmt, num_open.rlim_cur);
      sprintf(strbuff, "dup() attempt %s failed", strbuff1);
      fprintf(stderr, "%s\n", strbuff);

      sprintf(strbuff1, fmt, num_open.rlim_cur);
      sprintf(strbuff, "fds system limit seems close to %s", strbuff1);
      fprintf(stderr, "%s\n", strbuff);

      num_open.rlim_max = NUM_NEEDED;

      sprintf(strbuff2, fmt, num_open.rlim_max);
      sprintf(strbuff1, fmt, num_open.rlim_cur);
      sprintf(strbuff, "fds needed %s > system limit %s",
              strbuff2, strbuff1);
      store_errmsg(strbuff, 0);
      fprintf(stderr, "%s\n", msgbuff);

      for (num_open.rlim_cur = 0;
           fd[num_open.rlim_cur] >= 0;
           num_open.rlim_cur++)
        close(fd[num_open.rlim_cur]);
      free(fd);
      fd = NULL;
      free(memchunk);
      return -9;

    }

  }

  sprintf(strbuff, fmt, num_open.rlim_max);
  fprintf(stderr, "%s file descriptors open\n", strbuff);

#if !defined(HAVE_POLL_FINE)    && \
    !defined(USE_WINSOCK)       && \
    !defined(TPF)

  /*
   * when using select() instead of poll() we cannot test
   * libcurl functionality with a socket number equal or
   * greater than FD_SETSIZE. In any case, macro VERIFY_SOCK
   * in lib/select.c enforces this check and protects libcurl
   * from a possible crash. The effect of this protection
   * is that test 518 will always fail, since the actual
   * call to select() never takes place. We skip test 518
   * with an indication that select limit would be exceeded.
   */

  num_open.rlim_cur = FD_SETSIZE - SAFETY_MARGIN;
  if (num_open.rlim_max > num_open.rlim_cur) {
    sprintf(strbuff, "select limit is FD_SETSIZE %d", FD_SETSIZE);
    store_errmsg(strbuff, 0);
    fprintf(stderr, "%s\n", msgbuff);
    close_file_descriptors();
    free(memchunk);
    return -10;
  }

  num_open.rlim_cur = FD_SETSIZE - SAFETY_MARGIN;
  for (rl.rlim_cur = 0;
       rl.rlim_cur < num_open.rlim_max;
       rl.rlim_cur++) {
    if ((fd[rl.rlim_cur] > 0) &&
       ((unsigned int)fd[rl.rlim_cur] > num_open.rlim_cur)) {
      sprintf(strbuff, "select limit is FD_SETSIZE %d", FD_SETSIZE);
      store_errmsg(strbuff, 0);
      fprintf(stderr, "%s\n", msgbuff);
      close_file_descriptors();
      free(memchunk);
      return -11;
    }
  }

#endif /* using a FD_SETSIZE bound select() */

  /*
   * Old or 'backwards compatible' implementations of stdio do not allow
   * handling of streams with an underlying file descriptor number greater
   * than 255, even when allowing high numbered file descriptors for sockets.
   * At this point we have a big number of file descriptors which have been
   * opened using dup(), so lets test the stdio implementation and discover
   * if it is capable of fopen()ing some additional files.
   */

  if (!fopen_works()) {
    sprintf(strbuff1, fmt, num_open.rlim_max);
    sprintf(strbuff, "stdio fopen() fails with %s fds open()",
            strbuff1);
    fprintf(stderr, "%s\n", msgbuff);
    sprintf(strbuff, "stdio fopen() fails with lots of fds open()");
    store_errmsg(strbuff, 0);
    close_file_descriptors();
    free(memchunk);
    return -12;
  }

  /* free the chunk of memory we were reserving so that it
     becomes becomes available to the test */

  free(memchunk);

  /* close file descriptors unless instructed to keep them */

  if (!keep_open) {
    close_file_descriptors();
  }

  return 0;
}